

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O0

void __thiscall
Eigen::JacobiRotation<double>::makeGivens
          (void *param_1,double *param_2,double *param_3,double *param_4)

{
  double dVar1;
  double dVar2;
  int __x;
  void *pvVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  type tVar4;
  double u_1;
  double t_1;
  double u;
  double t;
  undefined8 local_48;
  undefined8 local_38;
  
  __x = (int)param_1;
  if ((*param_3 != 0.0) || (NAN(*param_3))) {
    if ((*param_2 != 0.0) || (NAN(*param_2))) {
      pvVar3 = param_1;
      std::abs(__x);
      std::abs((int)pvVar3);
      if (extraout_XMM0_Qa_01 <= extraout_XMM0_Qa_02) {
        dVar1 = *param_2;
        dVar2 = *param_3;
        tVar4 = numext::abs2<double>((double *)0x302998);
        local_48 = sqrt(tVar4 + 1.0);
        if (*param_3 <= 0.0 && *param_3 != 0.0) {
          local_48 = -local_48;
        }
        *(double *)((long)param_1 + 8) = -1.0 / local_48;
        *(double *)param_1 = -(dVar1 / dVar2) * *(double *)((long)param_1 + 8);
        if (param_4 != (double *)0x0) {
          *param_4 = *param_3 * local_48;
        }
      }
      else {
        dVar1 = *param_3;
        dVar2 = *param_2;
        tVar4 = numext::abs2<double>((double *)0x3028c9);
        local_38 = sqrt(tVar4 + 1.0);
        if (*param_2 <= 0.0 && *param_2 != 0.0) {
          local_38 = -local_38;
        }
        *(double *)param_1 = 1.0 / local_38;
        *(double *)((long)param_1 + 8) = -(dVar1 / dVar2) * *param_1;
        if (param_4 != (double *)0x0) {
          *param_4 = *param_2 * local_38;
        }
      }
    }
    else {
      *(undefined8 *)param_1 = 0;
      *(ulong *)((long)param_1 + 8) =
           ~-(ulong)(*param_3 < 0.0) & 0xbff0000000000000 |
           (ulong)((uint)(-(ulong)(*param_3 < 0.0) >> 0x20) & 0x3ff00000) << 0x20;
      if (param_4 != (double *)0x0) {
        std::abs(__x);
        *param_4 = extraout_XMM0_Qa_00;
      }
    }
  }
  else {
    *(ulong *)param_1 =
         ~-(ulong)(*param_2 < 0.0) & 0x3ff0000000000000 |
         (ulong)((uint)(-(ulong)(*param_2 < 0.0) >> 0x20) & 0xbff00000) << 0x20;
    *(undefined8 *)((long)param_1 + 8) = 0;
    if (param_4 != (double *)0x0) {
      std::abs(__x);
      *param_4 = extraout_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void JacobiRotation<Scalar>::makeGivens(const Scalar& p, const Scalar& q, Scalar* r, internal::false_type)
{
  using std::sqrt;
  using std::abs;
  if(q==Scalar(0))
  {
    m_c = p<Scalar(0) ? Scalar(-1) : Scalar(1);
    m_s = Scalar(0);
    if(r) *r = abs(p);
  }
  else if(p==Scalar(0))
  {
    m_c = Scalar(0);
    m_s = q<Scalar(0) ? Scalar(1) : Scalar(-1);
    if(r) *r = abs(q);
  }
  else if(abs(p) > abs(q))
  {
    Scalar t = q/p;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(p<Scalar(0))
      u = -u;
    m_c = Scalar(1)/u;
    m_s = -t * m_c;
    if(r) *r = p * u;
  }
  else
  {
    Scalar t = p/q;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(q<Scalar(0))
      u = -u;
    m_s = -Scalar(1)/u;
    m_c = -t * m_s;
    if(r) *r = q * u;
  }

}